

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

void __thiscall
Filter::Filter(Filter *this,int input_size,int output_size,double *learning_rate,string *type)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  Clock *pCVar4;
  Layer *in_RDI;
  ulong in_R8;
  int *x;
  FIR *this_00;
  double normalizedFreq;
  string cutoffFreq;
  string filterType;
  int pos;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  string local_70 [32];
  string local_50 [32];
  undefined4 local_30;
  
  Layer::Layer(in_RDI);
  in_RDI->_vptr_Layer = (_func_int **)&PTR_forward_001988d8;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  FIR::FIR((FIR *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x16d35c);
  pCVar4 = Clock::getInstance();
  in_RDI[0x10]._vptr_Layer = (_func_int **)pCVar4;
  local_30 = std::__cxx11::string::find_first_of((char)in_R8,0x2c);
  std::__cxx11::string::substr((ulong)local_50,in_R8);
  std::__cxx11::string::substr((ulong)local_70,in_R8);
  iVar3 = std::__cxx11::stoi((string *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00)
                             ,(size_t *)in_stack_fffffffffffffef8,0);
  x = (int *)(double)iVar3;
  this_00 = (FIR *)Clock::getDt((Clock *)in_RDI[0x10]._vptr_Layer);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)this_00,x,
             (int *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  iVar3 = (int)((ulong)x >> 0x20);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
            );
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x16d495);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                          (char *)in_stack_fffffffffffffef8);
  if ((bool)uVar1) {
    FIR::lowpass(this_00,iVar3,(double)CONCAT17(uVar1,in_stack_ffffffffffffff10));
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                            (char *)in_stack_fffffffffffffef8);
    if (bVar2) {
      FIR::highpass(this_00,iVar3,(double)CONCAT17(uVar1,in_stack_ffffffffffffff10));
    }
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

Filter::Filter(int input_size, int output_size, double* learning_rate, string type) {
    clock = Clock::getInstance();
    int pos = type.find_first_of(',');
    string filterType = type.substr(0, pos);
    string cutoffFreq = type.substr(pos+1);
    double normalizedFreq = stoi(cutoffFreq) / (1.0 / clock->getDt());
    output = Eigen::MatrixXd(1, 1);
    if(filterType == "lowpass") {
        filter.lowpass(2000, normalizedFreq);
    }
    else if(filterType == "highpass") {
        filter.highpass(2000, normalizedFreq);
    }
}